

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

void icetGetDoublev(IceTEnum pname,IceTDouble *params)

{
  IceTEnum IVar1;
  IceTState pIVar2;
  char local_228 [8];
  char msg_1 [256];
  char msg [256];
  int i;
  IceTStateValue *value;
  IceTDouble *params_local;
  IceTEnum pname_local;
  
  pIVar2 = icetGetState();
  pIVar2 = pIVar2 + pname;
  IVar1 = pIVar2->type;
  if (IVar1 == 0) {
    sprintf(msg_1 + 0xf8,"No such parameter, 0x%x.",(ulong)pname);
    icetRaiseDiagnostic(msg_1 + 0xf8,0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                        ,0x149);
  }
  else if (IVar1 == 0x8000) {
    msg[0xfc] = '\0';
    msg[0xfd] = '\0';
    msg[0xfe] = '\0';
    msg[0xff] = '\0';
    for (; (int)msg._252_4_ < pIVar2->num_entries; msg._252_4_ = msg._252_4_ + 1) {
      params[(int)msg._252_4_] =
           (IceTDouble)(double)*(byte *)((long)pIVar2->data + (long)(int)msg._252_4_);
    }
  }
  else if (IVar1 == 0x8003) {
    msg[0xfc] = '\0';
    msg[0xfd] = '\0';
    msg[0xfe] = '\0';
    msg[0xff] = '\0';
    for (; (int)msg._252_4_ < pIVar2->num_entries; msg._252_4_ = msg._252_4_ + 1) {
      params[(int)msg._252_4_] =
           (IceTDouble)(double)*(int *)((long)pIVar2->data + (long)(int)msg._252_4_ * 4);
    }
  }
  else if (IVar1 == 0x8004) {
    msg[0xfc] = '\0';
    msg[0xfd] = '\0';
    msg[0xfe] = '\0';
    msg[0xff] = '\0';
    for (; (int)msg._252_4_ < pIVar2->num_entries; msg._252_4_ = msg._252_4_ + 1) {
      params[(int)msg._252_4_] =
           (IceTDouble)(double)*(float *)((long)pIVar2->data + (long)(int)msg._252_4_ * 4);
    }
  }
  else if (IVar1 == 0x8005) {
    msg[0xfc] = '\0';
    msg[0xfd] = '\0';
    msg[0xfe] = '\0';
    msg[0xff] = '\0';
    for (; (int)msg._252_4_ < pIVar2->num_entries; msg._252_4_ = msg._252_4_ + 1) {
      params[(int)msg._252_4_] = *(IceTDouble *)((long)pIVar2->data + (long)(int)msg._252_4_ * 8);
    }
  }
  else {
    sprintf(local_228,"Could not cast value for 0x%x.",(ulong)pname);
    icetRaiseDiagnostic(local_228,0xfffffffd,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                        ,0x149);
  }
  return;
}

Assistant:

void icetGetDoublev(IceTEnum pname, IceTDouble *params)
{
    struct IceTStateValue *value = icetGetState() + pname;
    int i;
    stateCheck(pname, icetGetState());
    copyArray(IceTDouble, params, value->type, value->data, value->num_entries);
}